

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBegin_advanced_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 unsigned_long_long pledgedSrcSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  
  auVar1._0_4_ = (params->cParams).windowLog;
  auVar1._4_4_ = (params->cParams).chainLog;
  auVar1._8_4_ = (params->cParams).hashLog;
  auVar1._12_4_ = (params->cParams).searchLog;
  auVar1 = vpaddd_avx(auVar1,_DAT_001a1300);
  auVar2 = vpminud_avx(auVar1,_DAT_001a1310);
  auVar1 = vpcmpeqd_avx(auVar1,auVar2);
  if (((((((auVar1 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
          (auVar1 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar1 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar1[0xf]) &&
       ((params->cParams).minMatch - 3 < 5)) && ((params->cParams).targetLength < 0x20001)) &&
     ((params->cParams).strategy - ZSTD_fast < 9)) {
    sVar3 = ZSTD_compressBegin_internal
                      (cctx,dict,dictSize,dictContentType,dtlm,cdict,params,pledgedSrcSize,
                       ZSTDb_not_buffered);
  }
  else {
    sVar3 = 0xffffffffffffffd6;
  }
  return sVar3;
}

Assistant:

size_t ZSTD_compressBegin_advanced_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params,
                                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_advanced_internal: wlog=%u", params->cParams.windowLog);
    /* compression parameters verification and optimization */
    FORWARD_IF_ERROR( ZSTD_checkCParams(params->cParams) );
    return ZSTD_compressBegin_internal(cctx,
                                       dict, dictSize, dictContentType, dtlm,
                                       cdict,
                                       params, pledgedSrcSize,
                                       ZSTDb_not_buffered);
}